

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanCommandBuffer::Draw
          (VulkanCommandBuffer *this,uint32_t VertexCount,uint32_t InstanceCount,
          uint32_t FirstVertex,uint32_t FirstInstance)

{
  bool bVar1;
  Char *pCVar2;
  undefined4 in_register_0000000c;
  undefined1 local_90 [8];
  string msg_2;
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  uint32_t FirstInstance_local;
  uint32_t FirstVertex_local;
  uint32_t InstanceCount_local;
  uint32_t VertexCount_local;
  VulkanCommandBuffer *this_local;
  
  msg.field_2._8_4_ = FirstInstance;
  msg.field_2._12_4_ = FirstVertex;
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",
               (char (*) [32])CONCAT44(in_register_0000000c,FirstVertex));
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar2,"Draw",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x73);
    std::__cxx11::string::~string((string *)local_40);
  }
  bVar1 = IsInRenderScope(this);
  if (!bVar1) {
    Diligent::FormatString<char[140]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [140])
               "vkCmdDraw() must be called inside render pass (https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdDraw-renderpass)"
              );
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar2,"Draw",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x76);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if ((this->m_State).GraphicsPipeline == (VkPipeline)0x0) {
    Diligent::FormatString<char[27]>((string *)local_90,(char (*) [27])"No graphics pipeline bound")
    ;
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar2,"Draw",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x77);
    std::__cxx11::string::~string((string *)local_90);
  }
  (*vkCmdDraw)(this->m_VkCmdBuffer,VertexCount,InstanceCount,msg.field_2._12_4_,msg.field_2._8_4_);
  return;
}

Assistant:

__forceinline void Draw(uint32_t VertexCount, uint32_t InstanceCount, uint32_t FirstVertex, uint32_t FirstInstance)
    {
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        VERIFY(IsInRenderScope(),
               "vkCmdDraw() must be called inside render pass "
               "(https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdDraw-renderpass)");
        VERIFY(m_State.GraphicsPipeline != VK_NULL_HANDLE, "No graphics pipeline bound");

        vkCmdDraw(m_VkCmdBuffer, VertexCount, InstanceCount, FirstVertex, FirstInstance);
    }